

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

void __thiscall QMessageBox::setButtonText(QMessageBox *this,int button,QString *text)

{
  QMessageBoxPrivate *this_00;
  long lVar1;
  QAbstractButton *this_01;
  QPushButton *this_02;
  long in_FS_OFFSET;
  QList<QAbstractButton_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_01 = QMessageBoxPrivate::abstractButtonForId(this_00,button);
  if (this_01 == (QAbstractButton *)0x0) {
    QDialogButtonBox::buttons(&local_40,(QDialogButtonBox *)this_00->buttonBox);
    if (local_40.d.size == 0) {
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
        }
      }
      if ((button == 0x400) || (button == 1)) {
        lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
        this_02 = QDialogButtonBox::addButton(*(QDialogButtonBox **)(lVar1 + 0x2f8),FirstButton);
        if (this_02 != (QPushButton *)0x0) {
          *(undefined1 *)(lVar1 + 0x349) = 0;
        }
        QAbstractButton::setText(&this_02->super_QAbstractButton,text);
      }
    }
    else if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QAbstractButton::setText(this_01,text);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setButtonText(int button, const QString &text)
{
    Q_D(QMessageBox);
    if (QAbstractButton *abstractButton = d->abstractButtonForId(button)) {
        abstractButton->setText(text);
    } else if (d->buttonBox->buttons().isEmpty() && (button == Ok || button == Old_Ok)) {
        // for compatibility with Qt 4.0/4.1
        addButton(QMessageBox::Ok)->setText(text);
    }
}